

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O1

vector<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
* LidlNormalizerData_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  vector<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  *in_RDI;
  long lVar5;
  long *plVar6;
  initializer_list<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>
  __l;
  allocator_type local_ad9;
  vector<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  *local_ad8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ad0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a10;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_990;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_950;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_910;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_890;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_850;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_810;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_790;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_750;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_710;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_690;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_650;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_610;
  tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  local_5d0;
  undefined8 local_588;
  char *local_580;
  size_type local_578;
  char local_570 [8];
  undefined8 uStack_568;
  char *local_560;
  size_type local_558;
  char local_550 [8];
  undefined8 uStack_548;
  undefined8 local_540;
  char *local_538;
  size_type local_530;
  char local_528 [8];
  undefined8 uStack_520;
  char *local_518;
  size_type local_510;
  char local_508 [8];
  undefined8 uStack_500;
  undefined8 local_4f8;
  char *local_4f0;
  size_type local_4e8;
  char local_4e0 [8];
  undefined8 uStack_4d8;
  char *local_4d0;
  size_type local_4c8;
  char local_4c0 [8];
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  char *local_4a8;
  size_type local_4a0;
  char local_498 [8];
  undefined8 uStack_490;
  char *local_488;
  size_type local_480;
  char local_478 [8];
  undefined8 uStack_470;
  undefined8 local_468;
  char *local_460;
  size_type local_458;
  char local_450 [8];
  undefined8 uStack_448;
  char *local_440;
  size_type local_438;
  char local_430 [8];
  undefined8 uStack_428;
  undefined8 local_420;
  char *local_418;
  size_type local_410;
  char local_408 [8];
  undefined8 uStack_400;
  char *local_3f8;
  size_type local_3f0;
  char local_3e8 [8];
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  char *local_3d0;
  size_type local_3c8;
  char local_3c0 [8];
  undefined8 uStack_3b8;
  char *local_3b0;
  size_type local_3a8;
  char local_3a0 [8];
  undefined8 uStack_398;
  undefined8 local_390;
  char *local_388;
  size_type local_380;
  char local_378 [8];
  undefined8 uStack_370;
  char *local_368;
  size_type local_360;
  char local_358 [8];
  undefined8 uStack_350;
  undefined8 local_348;
  char *local_340;
  size_type local_338;
  char local_330 [8];
  undefined8 uStack_328;
  char *local_320;
  size_type local_318;
  char local_310 [8];
  undefined8 uStack_308;
  undefined8 local_300;
  char *local_2f8;
  size_type local_2f0;
  char local_2e8 [8];
  undefined8 uStack_2e0;
  char *local_2d8;
  size_type local_2d0;
  char local_2c8 [8];
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  char *local_2b0;
  size_type local_2a8;
  char local_2a0 [8];
  undefined8 uStack_298;
  char *local_290;
  size_type local_288;
  char local_280 [8];
  undefined8 uStack_278;
  undefined8 local_270;
  char *local_268;
  size_type local_260;
  char local_258 [8];
  undefined8 uStack_250;
  char *local_248;
  size_type local_240;
  char local_238 [8];
  undefined8 uStack_230;
  undefined8 local_228;
  char *local_220;
  size_type local_218;
  char local_210 [8];
  undefined8 uStack_208;
  char *local_200;
  size_type local_1f8;
  char local_1f0 [8];
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  size_type local_1d0;
  char local_1c8 [8];
  undefined8 uStack_1c0;
  char *local_1b8;
  size_type local_1b0;
  char local_1a8 [8];
  undefined8 uStack_1a0;
  undefined8 local_198;
  char *local_190;
  size_type local_188;
  char local_180 [8];
  undefined8 uStack_178;
  char *local_170;
  size_type local_168;
  char local_160 [8];
  undefined8 uStack_158;
  undefined8 local_150;
  char *local_148;
  size_type local_140;
  char local_138 [8];
  undefined8 uStack_130;
  char *local_128;
  size_type local_120;
  char local_118 [8];
  undefined8 uStack_110;
  undefined8 local_108;
  char *local_100;
  size_type local_f8;
  char local_f0 [8];
  undefined8 uStack_e8;
  char *local_e0;
  size_type local_d8;
  char local_d0 [8];
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *local_b8;
  size_type local_b0;
  char local_a8 [8];
  undefined8 uStack_a0;
  char *local_98;
  size_type local_90;
  char local_88 [8];
  undefined8 uStack_80;
  undefined8 local_78;
  char *local_70;
  size_type local_68;
  char local_60 [8];
  undefined8 uStack_58;
  long *local_50;
  size_type local_48;
  long local_40;
  undefined8 uStack_38;
  
  local_ad8 = in_RDI;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[2],_true>
            (&local_6d0,&anon_var_dwarf_165db,(char (*) [2])0x157046);
  local_5d0.
  super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  .
  super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl.first._M_dataplus._M_p =
       (pointer)&local_5d0.
                 super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
                 .
                 super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                 ._M_head_impl.first.field_2;
  local_5d0.
  super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  .super__Tuple_impl<1UL,_std::pair<int,_int>_>.super__Head_base<1UL,_std::pair<int,_int>,_false>.
  _M_head_impl = (_Head_base<1UL,_std::pair<int,_int>,_false>)(pair<int,_int>)0x200000000;
  paVar1 = &local_6d0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.first._M_dataplus._M_p == paVar1) {
    local_5d0.
    super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
    .
    super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_head_impl.first.field_2._8_8_ = local_6d0.first.field_2._8_8_;
  }
  else {
    local_5d0.
    super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
    .
    super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_head_impl.first._M_dataplus._M_p = local_6d0.first._M_dataplus._M_p;
  }
  paVar2 = &local_6d0.second.field_2;
  local_5d0.
  super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  .
  super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl.second._M_dataplus._M_p =
       (pointer)&local_5d0.
                 super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
                 .
                 super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                 ._M_head_impl.second.field_2;
  local_5d0.
  super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  .
  super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl.first._M_string_length = local_6d0.first._M_string_length;
  local_6d0.first._M_string_length = 0;
  local_6d0.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.second._M_dataplus._M_p == paVar2) {
    local_5d0.
    super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
    .
    super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_head_impl.second.field_2._8_8_ = local_6d0.second.field_2._8_8_;
  }
  else {
    local_5d0.
    super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
    .
    super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_head_impl.second._M_dataplus._M_p = local_6d0.second._M_dataplus._M_p;
  }
  local_5d0.
  super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  .
  super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl.second._M_string_length = local_6d0.second._M_string_length;
  local_6d0.second._M_string_length = 0;
  local_6d0.second.field_2._M_local_buf[0] = '\0';
  local_6d0.first._M_dataplus._M_p = (pointer)paVar1;
  local_6d0.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[2],_true>
            (&local_710,&anon_var_dwarf_165e7,(char (*) [2])0x157046);
  local_580 = local_570;
  local_588 = 0x300000000;
  paVar1 = &local_710.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710.first._M_dataplus._M_p == paVar1) {
    uStack_568 = local_710.first.field_2._8_8_;
  }
  else {
    local_580 = local_710.first._M_dataplus._M_p;
  }
  paVar2 = &local_710.second.field_2;
  local_560 = local_550;
  local_578 = local_710.first._M_string_length;
  local_710.first._M_string_length = 0;
  local_710.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710.second._M_dataplus._M_p == paVar2) {
    uStack_548 = local_710.second.field_2._8_8_;
  }
  else {
    local_560 = local_710.second._M_dataplus._M_p;
  }
  local_558 = local_710.second._M_string_length;
  local_710.second._M_string_length = 0;
  local_710.second.field_2._M_local_buf[0] = '\0';
  local_710.first._M_dataplus._M_p = (pointer)paVar1;
  local_710.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[2],_true>
            (&local_750,&anon_var_dwarf_165f3,(char (*) [2])0x157046);
  local_538 = local_528;
  local_540 = 0x300000000;
  paVar1 = &local_750.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750.first._M_dataplus._M_p == paVar1) {
    uStack_520 = local_750.first.field_2._8_8_;
  }
  else {
    local_538 = local_750.first._M_dataplus._M_p;
  }
  paVar2 = &local_750.second.field_2;
  local_518 = local_508;
  local_530 = local_750.first._M_string_length;
  local_750.first._M_string_length = 0;
  local_750.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750.second._M_dataplus._M_p == paVar2) {
    uStack_500 = local_750.second.field_2._8_8_;
  }
  else {
    local_518 = local_750.second._M_dataplus._M_p;
  }
  local_510 = local_750.second._M_string_length;
  local_750.second._M_string_length = 0;
  local_750.second.field_2._M_local_buf[0] = '\0';
  local_750.first._M_dataplus._M_p = (pointer)paVar1;
  local_750.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[11],_const_char_(&)[10],_true>
            (&local_790,&anon_var_dwarf_16eab,(char (*) [10])"ABC A DEF");
  local_4f0 = local_4e0;
  local_4f8 = 0xa00000000;
  paVar1 = &local_790.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p == paVar1) {
    uStack_4d8 = local_790.first.field_2._8_8_;
  }
  else {
    local_4f0 = local_790.first._M_dataplus._M_p;
  }
  paVar2 = &local_790.second.field_2;
  local_4d0 = local_4c0;
  local_4e8 = local_790.first._M_string_length;
  local_790.first._M_string_length = 0;
  local_790.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.second._M_dataplus._M_p == paVar2) {
    uStack_4b8 = local_790.second.field_2._8_8_;
  }
  else {
    local_4d0 = local_790.second._M_dataplus._M_p;
  }
  local_4c8 = local_790.second._M_string_length;
  local_790.second._M_string_length = 0;
  local_790.second.field_2._M_local_buf[0] = '\0';
  local_790.first._M_dataplus._M_p = (pointer)paVar1;
  local_790.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[30],_const_char_(&)[12],_true>
            (&local_7d0,&anon_var_dwarf_16edf,(char (*) [12])"SMOL NATION");
  local_4a8 = local_498;
  local_4b0 = 0x1d00000000;
  paVar1 = &local_7d0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.first._M_dataplus._M_p == paVar1) {
    uStack_490 = local_7d0.first.field_2._8_8_;
  }
  else {
    local_4a8 = local_7d0.first._M_dataplus._M_p;
  }
  paVar2 = &local_7d0.second.field_2;
  local_488 = local_478;
  local_4a0 = local_7d0.first._M_string_length;
  local_7d0.first._M_string_length = 0;
  local_7d0.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.second._M_dataplus._M_p == paVar2) {
    uStack_470 = local_7d0.second.field_2._8_8_;
  }
  else {
    local_488 = local_7d0.second._M_dataplus._M_p;
  }
  local_480 = local_7d0.second._M_string_length;
  local_7d0.second._M_string_length = 0;
  local_7d0.second.field_2._M_local_buf[0] = '\0';
  local_7d0.first._M_dataplus._M_p = (pointer)paVar1;
  local_7d0.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[4],_true>
            (&local_810,&anon_var_dwarf_16f05,(char (*) [4])"NIG");
  local_460 = local_450;
  local_468 = 0x600000000;
  paVar1 = &local_810.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810.first._M_dataplus._M_p == paVar1) {
    uStack_448 = local_810.first.field_2._8_8_;
  }
  else {
    local_460 = local_810.first._M_dataplus._M_p;
  }
  paVar2 = &local_810.second.field_2;
  local_440 = local_430;
  local_458 = local_810.first._M_string_length;
  local_810.first._M_string_length = 0;
  local_810.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810.second._M_dataplus._M_p == paVar2) {
    uStack_428 = local_810.second.field_2._8_8_;
  }
  else {
    local_440 = local_810.second._M_dataplus._M_p;
  }
  local_438 = local_810.second._M_string_length;
  local_810.second._M_string_length = 0;
  local_810.second.field_2._M_local_buf[0] = '\0';
  local_810.first._M_dataplus._M_p = (pointer)paVar1;
  local_810.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[11],_const_char_(&)[5],_true>
            (&local_850,&anon_var_dwarf_16f1d,(char (*) [5])"UAXD");
  local_418 = local_408;
  local_420 = 0xa00000000;
  paVar1 = &local_850.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850.first._M_dataplus._M_p == paVar1) {
    uStack_400 = local_850.first.field_2._8_8_;
  }
  else {
    local_418 = local_850.first._M_dataplus._M_p;
  }
  paVar2 = &local_850.second.field_2;
  local_3f8 = local_3e8;
  local_410 = local_850.first._M_string_length;
  local_850.first._M_string_length = 0;
  local_850.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850.second._M_dataplus._M_p == paVar2) {
    uStack_3e0 = local_850.second.field_2._8_8_;
  }
  else {
    local_3f8 = local_850.second._M_dataplus._M_p;
  }
  local_3f0 = local_850.second._M_string_length;
  local_850.second._M_string_length = 0;
  local_850.second.field_2._M_local_buf[0] = '\0';
  local_850.first._M_dataplus._M_p = (pointer)paVar1;
  local_850.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[9],_true>
            (&local_890,&anon_var_dwarf_16f35,(char (*) [9])"FREE ICE");
  local_3d0 = local_3c0;
  local_3d8 = 0x800000000;
  paVar1 = &local_890.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890.first._M_dataplus._M_p == paVar1) {
    uStack_3b8 = local_890.first.field_2._8_8_;
  }
  else {
    local_3d0 = local_890.first._M_dataplus._M_p;
  }
  paVar2 = &local_890.second.field_2;
  local_3b0 = local_3a0;
  local_3c8 = local_890.first._M_string_length;
  local_890.first._M_string_length = 0;
  local_890.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890.second._M_dataplus._M_p == paVar2) {
    uStack_398 = local_890.second.field_2._8_8_;
  }
  else {
    local_3b0 = local_890.second._M_dataplus._M_p;
  }
  local_3a8 = local_890.second._M_string_length;
  local_890.second._M_string_length = 0;
  local_890.second.field_2._M_local_buf[0] = '\0';
  local_890.first._M_dataplus._M_p = (pointer)paVar1;
  local_890.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[14],_true>
            (&local_8d0,&anon_var_dwarf_16f4d,(char (*) [14])"CHOCOLATE NIB");
  local_388 = local_378;
  local_390 = 0x1300000000;
  paVar1 = &local_8d0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.first._M_dataplus._M_p == paVar1) {
    uStack_370 = local_8d0.first.field_2._8_8_;
  }
  else {
    local_388 = local_8d0.first._M_dataplus._M_p;
  }
  paVar2 = &local_8d0.second.field_2;
  local_368 = local_358;
  local_380 = local_8d0.first._M_string_length;
  local_8d0.first._M_string_length = 0;
  local_8d0.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.second._M_dataplus._M_p == paVar2) {
    uStack_350 = local_8d0.second.field_2._8_8_;
  }
  else {
    local_368 = local_8d0.second._M_dataplus._M_p;
  }
  local_360 = local_8d0.second._M_string_length;
  local_8d0.second._M_string_length = 0;
  local_8d0.second.field_2._M_local_buf[0] = '\0';
  local_8d0.first._M_dataplus._M_p = (pointer)paVar1;
  local_8d0.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[13],_const_char_(&)[10],_true>
            (&local_910,&anon_var_dwarf_16f65,(char (*) [10])"BLUEBERRY");
  local_340 = local_330;
  local_348 = 0xc00000000;
  paVar1 = &local_910.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.first._M_dataplus._M_p == paVar1) {
    uStack_328 = local_910.first.field_2._8_8_;
  }
  else {
    local_340 = local_910.first._M_dataplus._M_p;
  }
  paVar2 = &local_910.second.field_2;
  local_320 = local_310;
  local_338 = local_910.first._M_string_length;
  local_910.first._M_string_length = 0;
  local_910.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.second._M_dataplus._M_p == paVar2) {
    uStack_308 = local_910.second.field_2._8_8_;
  }
  else {
    local_320 = local_910.second._M_dataplus._M_p;
  }
  local_318 = local_910.second._M_string_length;
  local_910.second._M_string_length = 0;
  local_910.second.field_2._M_local_buf[0] = '\0';
  local_910.first._M_dataplus._M_p = (pointer)paVar1;
  local_910.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[2],_true>
            (&local_950,&anon_var_dwarf_1660b,(char (*) [2])0x1582b5);
  local_2f8 = local_2e8;
  local_300 = 0x300000000;
  paVar1 = &local_950.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950.first._M_dataplus._M_p == paVar1) {
    uStack_2e0 = local_950.first.field_2._8_8_;
  }
  else {
    local_2f8 = local_950.first._M_dataplus._M_p;
  }
  paVar2 = &local_950.second.field_2;
  local_2d8 = local_2c8;
  local_2f0 = local_950.first._M_string_length;
  local_950.first._M_string_length = 0;
  local_950.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950.second._M_dataplus._M_p == paVar2) {
    uStack_2c0 = local_950.second.field_2._8_8_;
  }
  else {
    local_2d8 = local_950.second._M_dataplus._M_p;
  }
  local_2d0 = local_950.second._M_string_length;
  local_950.second._M_string_length = 0;
  local_950.second.field_2._M_local_buf[0] = '\0';
  local_950.first._M_dataplus._M_p = (pointer)paVar1;
  local_950.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[12],_true>
            (&local_990,&anon_var_dwarf_16f7d,(char (*) [12])"U U O O A A");
  local_2b0 = local_2a0;
  local_2b8 = 0x1100000000;
  paVar1 = &local_990.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990.first._M_dataplus._M_p == paVar1) {
    uStack_298 = local_990.first.field_2._8_8_;
  }
  else {
    local_2b0 = local_990.first._M_dataplus._M_p;
  }
  paVar2 = &local_990.second.field_2;
  local_290 = local_280;
  local_2a8 = local_990.first._M_string_length;
  local_990.first._M_string_length = 0;
  local_990.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990.second._M_dataplus._M_p == paVar2) {
    uStack_278 = local_990.second.field_2._8_8_;
  }
  else {
    local_290 = local_990.second._M_dataplus._M_p;
  }
  local_288 = local_990.second._M_string_length;
  local_990.second._M_string_length = 0;
  local_990.second.field_2._M_local_buf[0] = '\0';
  local_990.first._M_dataplus._M_p = (pointer)paVar1;
  local_990.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (&local_9d0,&anon_var_dwarf_16e9f,(char (*) [3])"AE");
  local_268 = local_258;
  local_270 = 0x300000000;
  paVar1 = &local_9d0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.first._M_dataplus._M_p == paVar1) {
    uStack_250 = local_9d0.first.field_2._8_8_;
  }
  else {
    local_268 = local_9d0.first._M_dataplus._M_p;
  }
  paVar2 = &local_9d0.second.field_2;
  local_248 = local_238;
  local_260 = local_9d0.first._M_string_length;
  local_9d0.first._M_string_length = 0;
  local_9d0.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.second._M_dataplus._M_p == paVar2) {
    uStack_230 = local_9d0.second.field_2._8_8_;
  }
  else {
    local_248 = local_9d0.second._M_dataplus._M_p;
  }
  local_240 = local_9d0.second._M_string_length;
  local_9d0.second._M_string_length = 0;
  local_9d0.second.field_2._M_local_buf[0] = '\0';
  local_9d0.first._M_dataplus._M_p = (pointer)paVar1;
  local_9d0.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[100],_const_char_(&)[50],_true>
            (&local_a10,&anon_var_dwarf_16f95,
             (char (*) [50])"A B C D E F G H I J K L M N O P Q R S T U V W X Y");
  local_220 = local_210;
  local_228 = 0x6300000000;
  paVar1 = &local_a10.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.first._M_dataplus._M_p == paVar1) {
    uStack_208 = local_a10.first.field_2._8_8_;
  }
  else {
    local_220 = local_a10.first._M_dataplus._M_p;
  }
  paVar2 = &local_a10.second.field_2;
  local_200 = local_1f0;
  local_218 = local_a10.first._M_string_length;
  local_a10.first._M_string_length = 0;
  local_a10.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.second._M_dataplus._M_p == paVar2) {
    uStack_1e8 = local_a10.second.field_2._8_8_;
  }
  else {
    local_200 = local_a10.second._M_dataplus._M_p;
  }
  local_1f8 = local_a10.second._M_string_length;
  local_a10.second._M_string_length = 0;
  local_a10.second.field_2._M_local_buf[0] = '\0';
  local_a10.first._M_dataplus._M_p = (pointer)paVar1;
  local_a10.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[85],_const_char_(&)[29],_true>
            (&local_a50,&anon_var_dwarf_16fc9,(char (*) [29])"ZABCDEFGHIJKLMNOPQRSTUVWXYZ0");
  local_1d8 = local_1c8;
  local_1e0 = 0x5400000000;
  paVar1 = &local_a50.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50.first._M_dataplus._M_p == paVar1) {
    uStack_1c0 = local_a50.first.field_2._8_8_;
  }
  else {
    local_1d8 = local_a50.first._M_dataplus._M_p;
  }
  paVar2 = &local_a50.second.field_2;
  local_1b8 = local_1a8;
  local_1d0 = local_a50.first._M_string_length;
  local_a50.first._M_string_length = 0;
  local_a50.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50.second._M_dataplus._M_p == paVar2) {
    uStack_1a0 = local_a50.second.field_2._8_8_;
  }
  else {
    local_1b8 = local_a50.second._M_dataplus._M_p;
  }
  local_1b0 = local_a50.second._M_string_length;
  local_a50.second._M_string_length = 0;
  local_a50.second.field_2._M_local_buf[0] = '\0';
  local_a50.first._M_dataplus._M_p = (pointer)paVar1;
  local_a50.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[105],_const_char_(&)[27],_true>
            (&local_a90,&anon_var_dwarf_16ffd,(char (*) [27])"ABCDEFGHIJKLMNOPQRSTUVWXYZ");
  local_190 = local_180;
  local_198 = 0x6800000000;
  paVar1 = &local_a90.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90.first._M_dataplus._M_p == paVar1) {
    uStack_178 = local_a90.first.field_2._8_8_;
  }
  else {
    local_190 = local_a90.first._M_dataplus._M_p;
  }
  paVar2 = &local_a90.second.field_2;
  local_170 = local_160;
  local_188 = local_a90.first._M_string_length;
  local_a90.first._M_string_length = 0;
  local_a90.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90.second._M_dataplus._M_p == paVar2) {
    uStack_158 = local_a90.second.field_2._8_8_;
  }
  else {
    local_170 = local_a90.second._M_dataplus._M_p;
  }
  local_168 = local_a90.second._M_string_length;
  local_a90.second._M_string_length = 0;
  local_a90.second.field_2._M_local_buf[0] = '\0';
  local_a90.first._M_dataplus._M_p = (pointer)paVar1;
  local_a90.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[105],_const_char_(&)[27],_true>
            (&local_ad0,&anon_var_dwarf_17031,(char (*) [27])"ABCDEFGHIJKLMNOPQRSTUVWXYZ");
  local_148 = local_138;
  local_150 = 0x6800000000;
  paVar1 = &local_ad0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad0.first._M_dataplus._M_p == paVar1) {
    uStack_130 = local_ad0.first.field_2._8_8_;
  }
  else {
    local_148 = local_ad0.first._M_dataplus._M_p;
  }
  paVar2 = &local_ad0.second.field_2;
  local_128 = local_118;
  local_140 = local_ad0.first._M_string_length;
  local_ad0.first._M_string_length = 0;
  local_ad0.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad0.second._M_dataplus._M_p == paVar2) {
    uStack_110 = local_ad0.second.field_2._8_8_;
  }
  else {
    local_128 = local_ad0.second._M_dataplus._M_p;
  }
  local_120 = local_ad0.second._M_string_length;
  local_ad0.second._M_string_length = 0;
  local_ad0.second.field_2._M_local_buf[0] = '\0';
  local_ad0.first._M_dataplus._M_p = (pointer)paVar1;
  local_ad0.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[66],_const_char_(&)[27],_true>
            (&local_650,&anon_var_dwarf_1703d,(char (*) [27])"ABCDEFGHIJKLMNOPQRSTUVWXYZ");
  local_100 = local_f0;
  local_108 = 0x4100000000;
  paVar1 = &local_650.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.first._M_dataplus._M_p == paVar1) {
    uStack_e8 = local_650.first.field_2._8_8_;
  }
  else {
    local_100 = local_650.first._M_dataplus._M_p;
  }
  paVar2 = &local_650.second.field_2;
  local_e0 = local_d0;
  local_f8 = local_650.first._M_string_length;
  local_650.first._M_string_length = 0;
  local_650.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.second._M_dataplus._M_p == paVar2) {
    uStack_c8 = local_650.second.field_2._8_8_;
  }
  else {
    local_e0 = local_650.second._M_dataplus._M_p;
  }
  local_d8 = local_650.second._M_string_length;
  local_650.second._M_string_length = 0;
  local_650.second.field_2._M_local_buf[0] = '\0';
  local_650.first._M_dataplus._M_p = (pointer)paVar1;
  local_650.second._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[105],_const_char_(&)[27],_true>
            (&local_690,&anon_var_dwarf_17057,(char (*) [27])"ABCDEFGHIJKLMNOPQRSTUVWXYZ");
  local_b8 = local_a8;
  local_c0 = 0x6800000000;
  paVar1 = &local_690.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.first._M_dataplus._M_p == paVar1) {
    uStack_a0 = local_690.first.field_2._8_8_;
  }
  else {
    local_b8 = local_690.first._M_dataplus._M_p;
  }
  paVar3 = &local_690.second.field_2;
  local_98 = local_88;
  local_b0 = local_690.first._M_string_length;
  local_690.first._M_string_length = 0;
  local_690.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.second._M_dataplus._M_p == paVar3) {
    uStack_80 = local_690.second.field_2._8_8_;
  }
  else {
    local_98 = local_690.second._M_dataplus._M_p;
  }
  local_90 = local_690.second._M_string_length;
  local_690.second._M_string_length = 0;
  local_690.second.field_2._M_local_buf[0] = '\0';
  local_690.first._M_dataplus._M_p = (pointer)paVar1;
  local_690.second._M_dataplus._M_p = (pointer)paVar3;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[105],_const_char_(&)[27],_true>
            (&local_610,&anon_var_dwarf_17063,(char (*) [27])"ABCDEFGHIJKLMNOPQRSTUVWXYZ");
  local_70 = local_60;
  local_78 = 0x6800000000;
  paVar1 = &local_610.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.first._M_dataplus._M_p == paVar1) {
    uStack_58 = local_610.first.field_2._8_8_;
  }
  else {
    local_70 = local_610.first._M_dataplus._M_p;
  }
  paVar4 = &local_610.second.field_2;
  plVar6 = &local_40;
  local_68 = local_610.first._M_string_length;
  local_610.first._M_string_length = 0;
  local_610.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.second._M_dataplus._M_p == paVar4) {
    uStack_38 = local_610.second.field_2._8_8_;
    local_50 = plVar6;
  }
  else {
    local_50 = (long *)local_610.second._M_dataplus._M_p;
  }
  local_48 = local_610.second._M_string_length;
  local_610.second._M_string_length = 0;
  local_610.second.field_2._M_local_buf[0] = '\0';
  __l._M_len = 0x14;
  __l._M_array = &local_5d0;
  local_610.first._M_dataplus._M_p = (pointer)paVar1;
  local_610.second._M_dataplus._M_p = (pointer)paVar4;
  std::
  vector<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  ::vector(local_ad8,__l,&local_ad9);
  lVar5 = -0x5a0;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    if (plVar6 + -4 != (long *)plVar6[-6]) {
      operator_delete((long *)plVar6[-6],plVar6[-4] + 1);
    }
    plVar6 = plVar6 + -9;
    lVar5 = lVar5 + 0x48;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.second._M_dataplus._M_p != paVar4) {
    operator_delete(local_610.second._M_dataplus._M_p,
                    CONCAT71(local_610.second.field_2._M_allocated_capacity._1_7_,
                             local_610.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_610.first._M_dataplus._M_p,
                    CONCAT71(local_610.first.field_2._M_allocated_capacity._1_7_,
                             local_610.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.second._M_dataplus._M_p != paVar3) {
    operator_delete(local_690.second._M_dataplus._M_p,
                    CONCAT71(local_690.second.field_2._M_allocated_capacity._1_7_,
                             local_690.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.first._M_dataplus._M_p != &local_690.first.field_2) {
    operator_delete(local_690.first._M_dataplus._M_p,
                    CONCAT71(local_690.first.field_2._M_allocated_capacity._1_7_,
                             local_690.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.second._M_dataplus._M_p != paVar2) {
    operator_delete(local_650.second._M_dataplus._M_p,
                    CONCAT71(local_650.second.field_2._M_allocated_capacity._1_7_,
                             local_650.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.first._M_dataplus._M_p != &local_650.first.field_2) {
    operator_delete(local_650.first._M_dataplus._M_p,
                    CONCAT71(local_650.first.field_2._M_allocated_capacity._1_7_,
                             local_650.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad0.second._M_dataplus._M_p != &local_ad0.second.field_2) {
    operator_delete(local_ad0.second._M_dataplus._M_p,
                    CONCAT71(local_ad0.second.field_2._M_allocated_capacity._1_7_,
                             local_ad0.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad0.first._M_dataplus._M_p != &local_ad0.first.field_2) {
    operator_delete(local_ad0.first._M_dataplus._M_p,
                    CONCAT71(local_ad0.first.field_2._M_allocated_capacity._1_7_,
                             local_ad0.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90.second._M_dataplus._M_p != &local_a90.second.field_2) {
    operator_delete(local_a90.second._M_dataplus._M_p,
                    CONCAT71(local_a90.second.field_2._M_allocated_capacity._1_7_,
                             local_a90.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90.first._M_dataplus._M_p != &local_a90.first.field_2) {
    operator_delete(local_a90.first._M_dataplus._M_p,
                    CONCAT71(local_a90.first.field_2._M_allocated_capacity._1_7_,
                             local_a90.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50.second._M_dataplus._M_p != &local_a50.second.field_2) {
    operator_delete(local_a50.second._M_dataplus._M_p,
                    CONCAT71(local_a50.second.field_2._M_allocated_capacity._1_7_,
                             local_a50.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50.first._M_dataplus._M_p != &local_a50.first.field_2) {
    operator_delete(local_a50.first._M_dataplus._M_p,
                    CONCAT71(local_a50.first.field_2._M_allocated_capacity._1_7_,
                             local_a50.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.second._M_dataplus._M_p != &local_a10.second.field_2) {
    operator_delete(local_a10.second._M_dataplus._M_p,
                    CONCAT71(local_a10.second.field_2._M_allocated_capacity._1_7_,
                             local_a10.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.first._M_dataplus._M_p != &local_a10.first.field_2) {
    operator_delete(local_a10.first._M_dataplus._M_p,
                    CONCAT71(local_a10.first.field_2._M_allocated_capacity._1_7_,
                             local_a10.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.second._M_dataplus._M_p != &local_9d0.second.field_2) {
    operator_delete(local_9d0.second._M_dataplus._M_p,
                    CONCAT71(local_9d0.second.field_2._M_allocated_capacity._1_7_,
                             local_9d0.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.first._M_dataplus._M_p != &local_9d0.first.field_2) {
    operator_delete(local_9d0.first._M_dataplus._M_p,
                    CONCAT71(local_9d0.first.field_2._M_allocated_capacity._1_7_,
                             local_9d0.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990.second._M_dataplus._M_p != &local_990.second.field_2) {
    operator_delete(local_990.second._M_dataplus._M_p,
                    CONCAT71(local_990.second.field_2._M_allocated_capacity._1_7_,
                             local_990.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990.first._M_dataplus._M_p != &local_990.first.field_2) {
    operator_delete(local_990.first._M_dataplus._M_p,
                    CONCAT71(local_990.first.field_2._M_allocated_capacity._1_7_,
                             local_990.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950.second._M_dataplus._M_p != &local_950.second.field_2) {
    operator_delete(local_950.second._M_dataplus._M_p,
                    CONCAT71(local_950.second.field_2._M_allocated_capacity._1_7_,
                             local_950.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950.first._M_dataplus._M_p != &local_950.first.field_2) {
    operator_delete(local_950.first._M_dataplus._M_p,
                    CONCAT71(local_950.first.field_2._M_allocated_capacity._1_7_,
                             local_950.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.second._M_dataplus._M_p != &local_910.second.field_2) {
    operator_delete(local_910.second._M_dataplus._M_p,
                    CONCAT71(local_910.second.field_2._M_allocated_capacity._1_7_,
                             local_910.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.first._M_dataplus._M_p != &local_910.first.field_2) {
    operator_delete(local_910.first._M_dataplus._M_p,
                    CONCAT71(local_910.first.field_2._M_allocated_capacity._1_7_,
                             local_910.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.second._M_dataplus._M_p != &local_8d0.second.field_2) {
    operator_delete(local_8d0.second._M_dataplus._M_p,
                    CONCAT71(local_8d0.second.field_2._M_allocated_capacity._1_7_,
                             local_8d0.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.first._M_dataplus._M_p != &local_8d0.first.field_2) {
    operator_delete(local_8d0.first._M_dataplus._M_p,
                    CONCAT71(local_8d0.first.field_2._M_allocated_capacity._1_7_,
                             local_8d0.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890.second._M_dataplus._M_p != &local_890.second.field_2) {
    operator_delete(local_890.second._M_dataplus._M_p,
                    CONCAT71(local_890.second.field_2._M_allocated_capacity._1_7_,
                             local_890.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890.first._M_dataplus._M_p != &local_890.first.field_2) {
    operator_delete(local_890.first._M_dataplus._M_p,
                    CONCAT71(local_890.first.field_2._M_allocated_capacity._1_7_,
                             local_890.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850.second._M_dataplus._M_p != &local_850.second.field_2) {
    operator_delete(local_850.second._M_dataplus._M_p,
                    CONCAT71(local_850.second.field_2._M_allocated_capacity._1_7_,
                             local_850.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850.first._M_dataplus._M_p != &local_850.first.field_2) {
    operator_delete(local_850.first._M_dataplus._M_p,
                    CONCAT71(local_850.first.field_2._M_allocated_capacity._1_7_,
                             local_850.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810.second._M_dataplus._M_p != &local_810.second.field_2) {
    operator_delete(local_810.second._M_dataplus._M_p,
                    CONCAT71(local_810.second.field_2._M_allocated_capacity._1_7_,
                             local_810.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810.first._M_dataplus._M_p != &local_810.first.field_2) {
    operator_delete(local_810.first._M_dataplus._M_p,
                    CONCAT71(local_810.first.field_2._M_allocated_capacity._1_7_,
                             local_810.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.second._M_dataplus._M_p != &local_7d0.second.field_2) {
    operator_delete(local_7d0.second._M_dataplus._M_p,
                    CONCAT71(local_7d0.second.field_2._M_allocated_capacity._1_7_,
                             local_7d0.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.first._M_dataplus._M_p != &local_7d0.first.field_2) {
    operator_delete(local_7d0.first._M_dataplus._M_p,
                    CONCAT71(local_7d0.first.field_2._M_allocated_capacity._1_7_,
                             local_7d0.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.second._M_dataplus._M_p != &local_790.second.field_2) {
    operator_delete(local_790.second._M_dataplus._M_p,
                    CONCAT71(local_790.second.field_2._M_allocated_capacity._1_7_,
                             local_790.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != &local_790.first.field_2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    CONCAT71(local_790.first.field_2._M_allocated_capacity._1_7_,
                             local_790.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750.second._M_dataplus._M_p != &local_750.second.field_2) {
    operator_delete(local_750.second._M_dataplus._M_p,
                    CONCAT71(local_750.second.field_2._M_allocated_capacity._1_7_,
                             local_750.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750.first._M_dataplus._M_p != &local_750.first.field_2) {
    operator_delete(local_750.first._M_dataplus._M_p,
                    CONCAT71(local_750.first.field_2._M_allocated_capacity._1_7_,
                             local_750.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710.second._M_dataplus._M_p != &local_710.second.field_2) {
    operator_delete(local_710.second._M_dataplus._M_p,
                    CONCAT71(local_710.second.field_2._M_allocated_capacity._1_7_,
                             local_710.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710.first._M_dataplus._M_p != &local_710.first.field_2) {
    operator_delete(local_710.first._M_dataplus._M_p,
                    CONCAT71(local_710.first.field_2._M_allocated_capacity._1_7_,
                             local_710.first.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.second._M_dataplus._M_p != &local_6d0.second.field_2) {
    operator_delete(local_6d0.second._M_dataplus._M_p,
                    CONCAT71(local_6d0.second.field_2._M_allocated_capacity._1_7_,
                             local_6d0.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.first._M_dataplus._M_p != &local_6d0.first.field_2) {
    operator_delete(local_6d0.first._M_dataplus._M_p,
                    CONCAT71(local_6d0.first.field_2._M_allocated_capacity._1_7_,
                             local_6d0.first.field_2._M_local_buf[0]) + 1);
  }
  return local_ad8;
}

Assistant:

std::vector<std::tuple<std::pair<std::string, std::string>, std::pair<int, int>>> LidlNormalizerData()
{
	return {
		std::make_tuple(std::pair<std::string, std::string>("\U00000105", "A"), std::pair<int, int>(0, 2)),
		std::make_tuple(std::pair<std::string, std::string>("\U0000ab31", "A"), std::pair<int, int>(0, 3)),
		std::make_tuple(std::pair<std::string, std::string>("\U00001d43", "A"), std::pair<int, int>(0, 3)),
		std::make_tuple(std::pair<std::string, std::string>("abc \U000000e5 def", "ABC A DEF"), std::pair<int, int>(0, 10)),
		std::make_tuple(std::pair<std::string, std::string>("\U000002e2\U00001d50\U00001d52\U000002e1 \U0000207f\U00001d43\U00001d57\U00001da6\U00001d52\U0000207f", "SMOL NATION"), std::pair<int, int>(0, 29)),
		std::make_tuple(std::pair<std::string, std::string>("\U0000041d\U00000438\U00000433", "NIG"), std::pair<int, int>(0, 6)),
		std::make_tuple(std::pair<std::string, std::string>("\U0001f1fa\U0001f1e6XD", "UAXD"), std::pair<int, int>(0, 10)),
		std::make_tuple(std::pair<std::string, std::string>("\U0001f193 ICE", "FREE ICE"), std::pair<int, int>(0, 8)),
		std::make_tuple(std::pair<std::string, std::string>("chocolate \U0001F1F3\U0001F1EEb", "CHOCOLATE NIB"), std::pair<int, int>(0, 19)),
		std::make_tuple(std::pair<std::string, std::string>("\U0001f171lueberry", "BLUEBERRY"), std::pair<int, int>(0, 12)),
		std::make_tuple(std::pair<std::string, std::string>("\U0000249d", "B"), std::pair<int, int>(0, 3)),
		std::make_tuple(std::pair<std::string, std::string>("\U000000fc \U000000dc \U000000f6 \U000000d6 \U000000e4 \U000000c4", "U U O O A A"), std::pair<int, int>(0, 17)),
		std::make_tuple(std::pair<std::string, std::string>("\U00001d2d", "AE"), std::pair<int, int>(0, 3)),
		std::make_tuple(std::pair<std::string, std::string>("\U0000249c \U0000249d \U0000249e \U0000249f \U000024a0 \U000024a1 \U000024a2 \U000024a3 \U000024a4 \U000024a5 \U000024a6 \U000024a7 \U000024a8 \U000024a9 \U000024aa \U000024ab \U000024ac \U000024ad \U000024ae \U000024af \U000024b0 \U000024b1 \U000024b2 \U000024b3 \U000024b4", "A B C D E F G H I J K L M N O P Q R S T U V W X Y"), std::pair<int, int>(0, 99)),
		std::make_tuple(std::pair<std::string, std::string>("\U000024cf\U000024d0\U000024d1\U000024d2\U000024d3\U000024d4\U000024d5\U000024d6\U000024d7\U000024d8\U000024d9\U000024da\U000024db\U000024dc\U000024dd\U000024de\U000024df\U000024e0\U000024e1\U000024e2\U000024e3\U000024e4\U000024e5\U000024e6\U000024e7\U000024e8\U000024e9\U000024ea", "ZABCDEFGHIJKLMNOPQRSTUVWXYZ0"), std::pair<int, int>(0, 84)),
		std::make_tuple(std::pair<std::string, std::string>("\U0001d552\U0001d553\U0001d554\U0001d555\U0001d556\U0001d557\U0001d558\U0001d559\U0001d55a\U0001d55b\U0001d55c\U0001d55d\U0001d55e\U0001d55f\U0001d560\U0001d561\U0001d562\U0001d563\U0001d564\U0001d565\U0001d566\U0001d567\U0001d568\U0001d569\U0001d56a\U0001d56b", "ABCDEFGHIJKLMNOPQRSTUVWXYZ"), std::pair<int, int>(0, 104)),
		std::make_tuple(std::pair<std::string, std::string>("\U0001f130\U0001f131\U0001f132\U0001f133\U0001f134\U0001f135\U0001f136\U0001f137\U0001f138\U0001f139\U0001f13a\U0001f13b\U0001f13c\U0001f13d\U0001f13e\U0001f13f\U0001f140\U0001f141\U0001f142\U0001f143\U0001f144\U0001f145\U0001f146\U0001f147\U0001f148\U0001f149", "ABCDEFGHIJKLMNOPQRSTUVWXYZ"), std::pair<int, int>(0, 104)),
		std::make_tuple(std::pair<std::string, std::string>("\U000020b3\U00000e3f\U000020b5\U00000110\U00000246\U000020a3\U000020b2\U00002c67\U00000142J\U000020ad\U00002c60\U000020a5\U000020a6\U000000d8\U000020b1Q\U00002c64\U000020b4\U000020ae\U00000244V\U000020a9\U000004fe\U0000024e\U00002c6b", "ABCDEFGHIJKLMNOPQRSTUVWXYZ"), std::pair<int, int>(0, 65)),
		std::make_tuple(std::pair<std::string, std::string>("\U0001d586\U0001d587\U0001d588\U0001d589\U0001d58a\U0001d58b\U0001d58c\U0001d58d\U0001d58e\U0001d58f\U0001d590\U0001d591\U0001d592\U0001d593\U0001d594\U0001d595\U0001d596\U0001d597\U0001d598\U0001d599\U0001d59a\U0001d59b\U0001d59c\U0001d59d\U0001d59e\U0001d59f", "ABCDEFGHIJKLMNOPQRSTUVWXYZ"), std::pair<int, int>(0, 104)),
		std::make_tuple(std::pair<std::string, std::string>("\U0001f170\U0001f171\U0001f172\U0001f173\U0001f174\U0001f175\U0001f176\U0001f177\U0001f178\U0001f179\U0001f17a\U0001f17b\U0001f17c\U0001f17d\U0001f17e\U0001f17f\U0001f180\U0001f181\U0001f182\U0001f183\U0001f184\U0001f185\U0001f186\U0001f187\U0001f188\U0001f189", "ABCDEFGHIJKLMNOPQRSTUVWXYZ"), std::pair<int, int>(0, 104))
	};
}